

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::OpaqueAttribute::OpaqueAttribute(OpaqueAttribute *this,OpaqueAttribute *other)

{
  long size;
  
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__OpaqueAttribute_001e3d60;
  std::__cxx11::string::string((string *)&this->_typeName,(string *)&other->_typeName);
  size = other->_dataSize;
  this->_dataSize = size;
  Array<char>::Array(&this->_data,size);
  Array<char>::resizeErase(&this->_data,other->_dataSize);
  memcpy((this->_data)._data,(other->_data)._data,other->_dataSize);
  return;
}

Assistant:

OpaqueAttribute::OpaqueAttribute (const OpaqueAttribute& other)
    : _typeName (other._typeName)
    , _dataSize (other._dataSize)
    , _data (other._dataSize)
{
    _data.resizeErase (other._dataSize);
    memcpy ((char*) _data, (const char*) other._data, other._dataSize);
}